

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  size_t __n;
  char *__dest;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  pIVar2 = GImGui;
  pcVar4 = (GImGui->PrivateClipboard).Data;
  if (pcVar4 != (char *)0x0) {
    (pIVar2->PrivateClipboard).Size = 0;
    (pIVar2->PrivateClipboard).Capacity = 0;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
    (pIVar2->PrivateClipboard).Data = (char *)0x0;
  }
  __n = strlen(text);
  uVar1 = (uint)__n;
  iVar3 = uVar1 + 1;
  iVar5 = (pIVar2->PrivateClipboard).Capacity;
  if ((int)uVar1 < iVar5) {
    __dest = (char *)0x0;
    goto LAB_0014574e;
  }
  if (iVar5 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar5 / 2 + iVar5;
  }
  if (iVar5 <= iVar3) {
    iVar5 = iVar3;
  }
  GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar5,GImAllocatorUserData);
  pcVar4 = (pIVar2->PrivateClipboard).Data;
  if (pcVar4 == (char *)0x0) {
LAB_0014572f:
    pcVar4 = (char *)0x0;
  }
  else {
    memcpy(__dest,pcVar4,(long)(pIVar2->PrivateClipboard).Size);
    pcVar4 = (pIVar2->PrivateClipboard).Data;
    if (pcVar4 == (char *)0x0) goto LAB_0014572f;
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
  }
  (*GImAllocatorFreeFunc)(pcVar4,GImAllocatorUserData);
  (pIVar2->PrivateClipboard).Data = __dest;
  (pIVar2->PrivateClipboard).Capacity = iVar5;
LAB_0014574e:
  (pIVar2->PrivateClipboard).Size = iVar3;
  if (-1 < (int)uVar1) {
    memcpy(__dest,text,__n);
    if ((int)uVar1 < (pIVar2->PrivateClipboard).Size) {
      (pIVar2->PrivateClipboard).Data[uVar1 & 0x7fffffff] = '\0';
      return;
    }
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                ,0x49a,"value_type &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}